

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O3

void zSetupSpace(void *work,int_t lwork,GlobalLU_t *Glu)

{
  if (lwork != 0) {
    if (0 < lwork) {
      Glu->MemModel = USER;
      (Glu->stack).used = 0;
      (Glu->stack).top1 = 0;
      (Glu->stack).top2 = lwork & 0x7ffffffcU;
      (Glu->stack).size = lwork & 0x7ffffffcU;
      (Glu->stack).array = work;
    }
    return;
  }
  Glu->MemModel = SYSTEM;
  return;
}

Assistant:

void zSetupSpace(void *work, int_t lwork, GlobalLU_t *Glu)
{
    if ( lwork == 0 ) {
	Glu->MemModel = SYSTEM; /* malloc/free */
    } else if ( lwork > 0 ) {
	Glu->MemModel = USER;   /* user provided space */
	Glu->stack.used = 0;
	Glu->stack.top1 = 0;
	Glu->stack.top2 = (lwork/4)*4; /* must be word addressable */
	Glu->stack.size = Glu->stack.top2;
	Glu->stack.array = (void *) work;
    }
}